

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

bool __thiscall
ThreadContext::IsObjectRegisteredInStoreFieldInlineCaches(ThreadContext *this,DynamicObject *object)

{
  int iVar1;
  Type TVar2;
  Type pSVar3;
  InlineCache *this_00;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  Type *ppIVar8;
  Type *pTVar9;
  DynamicObject *this_01;
  ulong uVar10;
  int iVar11;
  Iterator local_50;
  ThreadContext *local_40;
  ulong local_38;
  
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  local_38 = 0;
  local_40 = this;
  do {
    uVar10 = (ulong)(local_40->storeFieldInlineCacheByPropId).bucketCount;
    if (uVar10 <= local_38) {
LAB_00715399:
      return local_38 < uVar10;
    }
    iVar11 = (local_40->storeFieldInlineCacheByPropId).buckets[local_38];
    if (iVar11 != -1) {
      while (iVar11 != -1) {
        pSVar3 = (local_40->storeFieldInlineCacheByPropId).entries;
        iVar1 = pSVar3[iVar11].
                super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .
                super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                .
                super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
                .
                super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                .next;
        local_50.list =
             &(pSVar3[iVar11].
               super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
               .
               super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
               .
               super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
               .
               super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
              .value)->super_SListBase<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>;
        local_50.current = &(local_50.list)->super_SListNodeBase<Memory::ArenaAllocator>;
LAB_00715236:
        if ((SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount> *)local_50.current ==
            (SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar5) {
LAB_007153af:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar7 = 0;
        }
        local_50.current =
             (((SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount> *)local_50.current)->
             super_SListBase<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>).
             super_SListNodeBase<Memory::ArenaAllocator>.next;
        iVar11 = iVar1;
        if ((SListBase<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount> *)local_50.current !=
            local_50.list) {
          ppIVar8 = SListBase<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                              (&local_50);
          this_00 = *ppIVar8;
          if ((this_00 != (InlineCache *)0x0) && ((this_00->u).local.type != (Type *)0x0)) {
            pTVar9 = Js::InlineCache::GetType(this_00);
            this_01 = (DynamicObject *)(pTVar9->prototype).ptr;
            while( true ) {
              if (this_01 == (DynamicObject *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar7 = 1;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                   ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
                if (!bVar5) goto LAB_007153af;
                *puVar7 = 0;
              }
              TVar2 = ((this_01->super_RecyclableObject).type.ptr)->typeId;
              if ((0x57 < (int)TVar2) &&
                 (BVar6 = Js::RecyclableObject::IsExternal(&this_01->super_RecyclableObject),
                 BVar6 == 0)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar7 = 1;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                   ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                   "GetTypeId aValue has invalid TypeId");
                if (!bVar5) goto LAB_007153af;
                *puVar7 = 0;
              }
              if ((TVar2 == TypeIds_Null) || (TVar2 == TypeIds_Proxy)) goto LAB_00715236;
              if (this_01 == object) break;
              this_01 = (DynamicObject *)
                        Js::RecyclableObject::GetPrototype(&this_01->super_RecyclableObject);
            }
            if (TVar2 != TypeIds_Proxy) goto LAB_00715399;
          }
          goto LAB_00715236;
        }
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

bool
ThreadContext::IsObjectRegisteredInStoreFieldInlineCaches(Js::DynamicObject * object)
{
    return storeFieldInlineCacheByPropId.MapUntil([object](Js::PropertyId propertyId, InlineCacheList* inlineCacheList)
    {
        FOREACH_SLISTBASE_ENTRY(Js::InlineCache*, inlineCache, inlineCacheList)
        {
            if (inlineCache != nullptr && !inlineCache->IsEmpty())
            {
                // Verify this object is not present in prototype chain of inlineCache's type
                bool isObjectPresentOnPrototypeChain =
                    Js::JavascriptOperators::MapObjectAndPrototypesUntil<true>(inlineCache->GetType()->GetPrototype(), [=](Js::RecyclableObject* prototype)
                {
                    return prototype == object;
                });
                if (isObjectPresentOnPrototypeChain) {
                    return true;
                }
            }
        }
        NEXT_SLISTBASE_ENTRY;
        return false;
    });
}